

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfUdpMulticast.c
# Opt level: O0

sbfError sbfUdpMulticast_send(sbfUdpMulticast s,void *buf,size_t len)

{
  size_t sVar1;
  int *piVar2;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  ssize_t sent;
  undefined4 local_4;
  
  sVar1 = sendto(*(int *)(in_RDI + 4),in_RSI,in_RDX,0,(sockaddr *)(in_RDI + 8),0x10);
  if ((long)sVar1 < 0) {
    piVar2 = __errno_location();
    local_4 = *piVar2;
  }
  else if (sVar1 == in_RDX) {
    local_4 = 0;
  }
  else {
    local_4 = 5;
  }
  return local_4;
}

Assistant:

sbfError
sbfUdpMulticast_send (sbfUdpMulticast s, const void* buf, size_t len)
{
#ifdef WIN32
    int sent;
#else
    ssize_t sent;
#endif

    sent = sendto (s->mSocket,
                   buf,
                   len,
                   0,
                   (struct sockaddr*)&s->mAddress,
                   sizeof s->mAddress);
    if (sent < 0)
        return errno;
    if ((size_t)sent != len)
        return EIO;
    return 0;
}